

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O3

int ZXing::DataMatrix::DMTextEncoder::EncodeChar(int c,string *sb)

{
  int iVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = 0;
  cVar2 = (char)sb;
  iVar3 = 1;
  if (c != 0x20) {
    iVar1 = 0;
    do {
      iVar3 = 1;
      if ((c - 0x30U < 10) || (c - 0x61U < 0x1a)) break;
      if ((uint)c < 0x20) {
        std::__cxx11::string::push_back(cVar2);
LAB_00158067:
        iVar3 = 2;
        break;
      }
      if (c < 0x30) {
        std::__cxx11::string::push_back(cVar2);
        goto LAB_00158067;
      }
      if ((uint)c < 0x41) {
        std::__cxx11::string::push_back(cVar2);
        goto LAB_00158067;
      }
      if (c - 0x5bU < 5) {
        std::__cxx11::string::push_back(cVar2);
        goto LAB_00158067;
      }
      if (c == 0x60) {
        std::__cxx11::string::push_back(cVar2);
        iVar3 = 2;
        break;
      }
      if ((uint)c < 0x5b) {
        std::__cxx11::string::push_back(cVar2);
        iVar3 = 2;
        break;
      }
      bVar4 = (uint)c < 0x80;
      c = c - 0x80;
      if (bVar4) {
        std::__cxx11::string::push_back(cVar2);
        iVar3 = 2;
        break;
      }
      std::__cxx11::string::append((char *)sb);
      iVar1 = iVar1 + 2;
      iVar3 = 1;
    } while (c != 0x20);
  }
  std::__cxx11::string::push_back(cVar2);
  return iVar1 + iVar3;
}

Assistant:

static int EncodeChar(int c, std::string& sb)
	{
		if (c == ' ') {
			sb.push_back('\3');
			return 1;
		}
		if (c >= '0' && c <= '9') {
			sb.push_back((char)(c - 48 + 4));
			return 1;
		}
		if (c >= 'a' && c <= 'z') {
			sb.push_back((char)(c - 97 + 14));
			return 1;
		}
		if (c >= '\0' && c <= '\x1f') {
			sb.push_back('\0'); //Shift 1 Set
			sb.push_back(c);
			return 2;
		}
		if (c <= '/') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 33));
			return 2;
		}
		if (c <= '@') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 58 + 15));
			return 2;
		}
		if (c >= '[' && c <= '_') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 91 + 22));
			return 2;
		}
		if (c == '\x60') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 96));
			return 2;
		}
		if (c <= 'Z') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 65 + 1));
			return 2;
		}
		if (c <= '\x7f') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 123 + 27));
			return 2;
		}
		sb.append("\1\x1e"); //Shift 2, Upper Shift
		int len = 2;
		len += EncodeChar(c - 128, sb);
		return len;
	}